

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
stable_split<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          tuple<int,_int,_int> *begin,comm *end,comm *param_5)

{
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  _Var1;
  bool bVar2;
  int iVar3;
  int rank;
  uint uVar4;
  size_type_conflict sVar5;
  unsigned_long n;
  const_reference pvVar6;
  const_reference y;
  difference_type dVar7;
  reference pvVar8;
  iterator __first;
  iterator __last;
  unsigned_long_long uVar9;
  pair<__gnu_cxx::__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>,___gnu_cxx::__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>_>
  pVar10;
  byte local_171;
  size_t out_size;
  uint targetp;
  size_t eq_size;
  pair<__gnu_cxx::__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>,___gnu_cxx::__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>_>
  eqr;
  ulong uStack_a0;
  uint split_by;
  size_t i;
  block_decomposition<unsigned_long> local_part;
  size_t local_size;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  pos;
  allocator<unsigned_long> local_49;
  value_type_conflict2 local_48;
  byte local_39;
  comm *local_38;
  comm *comm_local;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *splitters_local;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  local_20;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  end_local;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  begin_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_counts;
  
  local_38 = param_5;
  comm_local = end;
  local_20._M_current = begin;
  end_local._M_current = (tuple<int,_int,_int> *)this;
  sVar5 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::size
                    ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      *)end);
  iVar3 = mxx::comm::size(local_38);
  if (sVar5 != (long)iVar3 - 1U) {
    assert_fail("splitters.size() == (size_t) comm.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0x11d,"stable_split");
  }
  local_39 = 0;
  iVar3 = mxx::comm::size(local_38);
  local_48 = 0;
  std::allocator<unsigned_long>::allocator(&local_49);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)iVar3,&local_48,&local_49);
  std::allocator<unsigned_long>::~allocator(&local_49);
  local_size = (size_t)end_local._M_current;
  local_part._16_8_ = local_20._M_current;
  n = std::
      distance<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>>
                (end_local,local_20);
  iVar3 = mxx::comm::size(local_38);
  rank = mxx::comm::rank(local_38);
  partition::block_decomposition<unsigned_long>::block_decomposition
            ((block_decomposition<unsigned_long> *)&i,n,iVar3,rank);
  for (uStack_a0 = 0;
      sVar5 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
              size((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )comm_local), uStack_a0 < sVar5;
      uStack_a0 = eqr.second._M_current._4_4_ + uStack_a0) {
    eqr.second._M_current._4_4_ = 1;
    while( true ) {
      sVar5 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
              size((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )comm_local);
      local_171 = 0;
      if (uStack_a0 + eqr.second._M_current._4_4_ < sVar5) {
        pvVar6 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ::operator[]((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                               *)comm_local,uStack_a0);
        y = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
            operator[]((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        *)comm_local,uStack_a0 + eqr.second._M_current._4_4_);
        bVar2 = MxxSort_StableSort_Test::TestBody::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&splitters_local + 7),pvVar6,y);
        local_171 = bVar2 ^ 0xff;
      }
      _Var1._M_current = (tuple<int,_int,_int> *)local_20;
      if ((local_171 & 1) == 0) break;
      eqr.second._M_current._4_4_ = eqr.second._M_current._4_4_ + 1;
    }
    pvVar6 = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
             operator[]((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         *)comm_local,uStack_a0);
    pVar10 = std::
             equal_range<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,std::tuple<int,int,int>,MxxSort_StableSort_Test::TestBody()::__0>
                       (local_size,_Var1._M_current,pvVar6);
    dVar7 = std::
            distance<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>>
                      ((__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                        )local_size,pVar10.first._M_current);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,uStack_a0);
    *pvVar8 = *pvVar8 + dVar7;
    dVar7 = std::
            distance<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>>
                      (pVar10.first._M_current,pVar10.second._M_current);
    if (eqr.second._M_current._4_4_ == 1) {
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,uStack_a0 + 1);
      *pvVar8 = dVar7 + *pvVar8;
    }
    else {
      iVar3 = mxx::comm::rank(local_38);
      uVar4 = mxx::comm::size(local_38);
      out_size._4_4_ = (iVar3 * eqr.second._M_current._4_4_) / uVar4;
      if (eqr.second._M_current._4_4_ <= out_size._4_4_) {
        out_size._4_4_ = eqr.second._M_current._4_4_ - 1;
      }
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,uStack_a0 + 1 + (ulong)out_size._4_4_);
      *pvVar8 = dVar7 + *pvVar8;
    }
    local_size = (size_t)pVar10.second._M_current._M_current;
  }
  dVar7 = std::
          distance<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>>
                    ((__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                      )local_size,local_20);
  iVar3 = mxx::comm::size(local_38);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (__return_storage_ptr__,(long)(iVar3 + -1));
  *pvVar8 = dVar7 + *pvVar8;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      (__return_storage_ptr__);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__);
  uVar9 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_long>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__last._M_current,0);
  if (uVar9 != n) {
    assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0x146,"stable_split");
  }
  local_39 = 1;
  partition::block_decomposition<unsigned_long>::~block_decomposition
            ((block_decomposition<unsigned_long> *)&i);
  if ((local_39 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> stable_split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t) comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    partition::block_decomposition<std::size_t> local_part(local_size, comm.size(), comm.rank());
    for (std::size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        std::size_t eq_size = std::distance(pos, eqr.second);

        // send equal elements to processor based on my own rank compared to
        // how many equal splitters there are
        if (split_by == 1) {
            // 1) if there is only one splitter, assign equal elements to next processor (no splitting)
            send_counts[i+1] += eq_size;
        } else {
            // 2) if there is >= 2 equal splitters: split processors into `split_by` regions
            unsigned int targetp = (comm.rank() * split_by) / comm.size();
            if (targetp >= split_by) targetp = split_by-1;
            send_counts[i+1+targetp] += eq_size;
        }
        i += split_by;
        pos = eqr.second;
    }

    // send last elements to last processor
    std::size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size);
    return send_counts;
}